

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

float NGA_Fdot_patch64(int g_a,char t_a,int64_t *alo,int64_t *ahi,int g_b,char t_b,int64_t *blo,
                      int64_t *bhi)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  char t_b_local;
  char t_a_local;
  float res;
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  
  t_b_local = t_b;
  t_a_local = t_a;
  IVar1 = pnga_ndim((long)g_a);
  lVar2 = pnga_ndim((long)g_b);
  lVar3 = IVar1;
  if (0 < IVar1) {
    do {
      _ga_alo[lVar3 + -1] = *alo + 1;
      alo = alo + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    if (0 < IVar1) {
      do {
        _ga_ahi[IVar1 + -1] = *ahi + 1;
        ahi = ahi + 1;
        IVar1 = IVar1 + -1;
      } while (IVar1 != 0);
    }
  }
  lVar3 = lVar2;
  if (0 < lVar2) {
    do {
      _ga_blo[lVar3 + -1] = *blo + 1;
      blo = blo + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    if (0 < lVar2) {
      do {
        *(int64_t *)(&stack0xfffffffffffffed0 + lVar2 * 8) = *bhi + 1;
        bhi = bhi + 1;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
  }
  pnga_dot_patch((long)g_a,&t_a_local,_ga_alo,_ga_ahi,(long)g_b,&t_b_local,_ga_blo,_ga_bhi,&res);
  return res;
}

Assistant:

float NGA_Fdot_patch64(int g_a, char t_a, int64_t alo[], int64_t ahi[],
                       int g_b, char t_b, int64_t blo[], int64_t bhi[])
{
    float res;
    Integer a=(Integer)g_a;
    Integer andim = wnga_ndim(a);
 
    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);
 
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
 
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);
 
    wnga_dot_patch(a, &t_a, _ga_alo, _ga_ahi,
                   b, &t_b, _ga_blo, _ga_bhi, &res);
 
    return res;
}